

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

void libsgp4::Util::TrimRight(string *s)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  pcVar5 = pcVar1 + s->_M_string_length;
  lVar3 = (long)s->_M_string_length >> 2;
  pcVar4 = pcVar5;
  if (0 < lVar3) {
    pcVar4 = pcVar5 + lVar3 * -4;
    lVar3 = lVar3 + 1;
    do {
      iVar2 = isgraph((uint)(byte)pcVar5[-1]);
      if (iVar2 != 0) goto LAB_00109e3e;
      iVar2 = isgraph((uint)(byte)pcVar5[-2]);
      if (iVar2 != 0) {
        pcVar5 = pcVar5 + -1;
        goto LAB_00109e3e;
      }
      iVar2 = isgraph((uint)(byte)pcVar5[-3]);
      if (iVar2 != 0) {
        pcVar5 = pcVar5 + -2;
        goto LAB_00109e3e;
      }
      iVar2 = isgraph((uint)(byte)pcVar5[-4]);
      if (iVar2 != 0) {
        pcVar5 = pcVar5 + -3;
        goto LAB_00109e3e;
      }
      pcVar5 = pcVar5 + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pcVar4 - (long)pcVar1;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pcVar5 = pcVar1;
      if ((lVar3 != 3) || (iVar2 = isgraph((uint)(byte)pcVar4[-1]), pcVar5 = pcVar4, iVar2 != 0))
      goto LAB_00109e3e;
      pcVar4 = pcVar4 + -1;
    }
    iVar2 = isgraph((uint)(byte)pcVar4[-1]);
    pcVar5 = pcVar4;
    if (iVar2 != 0) goto LAB_00109e3e;
    pcVar4 = pcVar4 + -1;
  }
  iVar2 = isgraph((uint)(byte)pcVar4[-1]);
  pcVar5 = pcVar4;
  if (iVar2 == 0) {
    pcVar5 = pcVar1;
  }
LAB_00109e3e:
  s->_M_string_length = (long)pcVar5 - (long)pcVar1;
  *pcVar5 = '\0';
  return;
}

Assistant:

void TrimRight(std::string& s)
    {
        s.erase(std::find_if(s.rbegin(), s.rend(), [](unsigned char c){ return std::isgraph(c) != 0; }).base(),
                s.end());
    }